

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O0

vector<CAddress,_std::allocator<CAddress>_> * __thiscall
CConnman::GetCurrentBlockRelayOnlyConns(CConnman *this)

{
  long lVar1;
  bool bVar2;
  AnnotatedMixin<std::recursive_mutex> *pszName;
  char *in_RSI;
  vector<CAddress,_std::allocator<CAddress>_> *in_RDI;
  long in_FS_OFFSET;
  CNode *pnode;
  vector<CNode_*,_std::allocator<CNode_*>_> *__range1;
  vector<CAddress,_std::allocator<CAddress>_> *ret;
  const_iterator __end1;
  const_iterator __begin1;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock79;
  CNode *in_stack_ffffffffffffff68;
  value_type *in_stack_ffffffffffffff70;
  undefined7 in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff7f;
  AnnotatedMixin<std::recursive_mutex> *in_stack_ffffffffffffffa0;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *in_stack_ffffffffffffffa8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::vector<CAddress,_std::allocator<CAddress>_>::vector
            ((vector<CAddress,_std::allocator<CAddress>_> *)in_stack_ffffffffffffff68);
  pszName = MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
                      ((AnnotatedMixin<std::recursive_mutex> *)in_stack_ffffffffffffff68);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,(char *)pszName,in_RSI,
             (int)((ulong)in_RDI >> 0x20),SUB81((ulong)in_RDI >> 0x18,0));
  std::vector<CNode_*,_std::allocator<CNode_*>_>::begin
            ((vector<CNode_*,_std::allocator<CNode_*>_> *)in_stack_ffffffffffffff70);
  std::vector<CNode_*,_std::allocator<CNode_*>_>::end
            ((vector<CNode_*,_std::allocator<CNode_*>_> *)in_stack_ffffffffffffff70);
  while (bVar2 = __gnu_cxx::
                 operator==<CNode_*const_*,_std::vector<CNode_*,_std::allocator<CNode_*>_>_>
                           ((__normal_iterator<CNode_*const_*,_std::vector<CNode_*,_std::allocator<CNode_*>_>_>
                             *)CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78),
                            (__normal_iterator<CNode_*const_*,_std::vector<CNode_*,_std::allocator<CNode_*>_>_>
                             *)in_stack_ffffffffffffff70), ((bVar2 ^ 0xffU) & 1) != 0) {
    __gnu_cxx::__normal_iterator<CNode_*const_*,_std::vector<CNode_*,_std::allocator<CNode_*>_>_>::
    operator*((__normal_iterator<CNode_*const_*,_std::vector<CNode_*,_std::allocator<CNode_*>_>_> *)
              in_stack_ffffffffffffff68);
    in_stack_ffffffffffffff7f = CNode::IsBlockOnlyConn(in_stack_ffffffffffffff68);
    if ((bool)in_stack_ffffffffffffff7f) {
      std::vector<CAddress,_std::allocator<CAddress>_>::push_back
                ((vector<CAddress,_std::allocator<CAddress>_> *)
                 CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78),
                 in_stack_ffffffffffffff70);
    }
    __gnu_cxx::__normal_iterator<CNode_*const_*,_std::vector<CNode_*,_std::allocator<CNode_*>_>_>::
    operator++((__normal_iterator<CNode_*const_*,_std::vector<CNode_*,_std::allocator<CNode_*>_>_> *
               )in_stack_ffffffffffffff68);
  }
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_ffffffffffffff68);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

std::vector<CAddress> CConnman::GetCurrentBlockRelayOnlyConns() const
{
    std::vector<CAddress> ret;
    LOCK(m_nodes_mutex);
    for (const CNode* pnode : m_nodes) {
        if (pnode->IsBlockOnlyConn()) {
            ret.push_back(pnode->addr);
        }
    }

    return ret;
}